

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_26ba73::PulsePlayback::open(PulsePlayback *this,char *__file,int __oflag,...)

{
  PulseMainloop *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  ALuint AVar5;
  int extraout_EAX;
  int iVar6;
  pa_context *ppVar7;
  pa_stream *ppVar8;
  undefined8 uVar9;
  pa_operation *op;
  backend_exception *this_01;
  _Alloc_hider _Var10;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  long lVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pcVar14;
  pa_sample_spec local_74;
  unique_lock<std::mutex> plock;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  if (__file == (char *)0x0) {
    pcVar14 = (pointer)0x0;
    uVar9 = (pointer)0x0;
    goto LAB_001617e9;
  }
  if ((anonymous_namespace)::PlaybackDevices == DAT_0022a7c8) {
    PulseMainloop::probePlaybackDevices(&this->mMainloop);
  }
  pbVar1 = DAT_0022a7c8;
  lVar13 = (long)DAT_0022a7c8 - (long)(anonymous_namespace)::PlaybackDevices;
  __lhs = (anonymous_namespace)::PlaybackDevices;
  for (lVar11 = lVar13 >> 8; pbVar12 = __lhs, 0 < lVar11; lVar11 = lVar11 + -1) {
    bVar3 = std::operator==(__lhs,__file);
    if (bVar3) goto LAB_001617d3;
    bVar3 = std::operator==(__lhs + 2,__file);
    pbVar12 = __lhs + 2;
    if (bVar3) goto LAB_001617d3;
    bVar3 = std::operator==(__lhs + 4,__file);
    pbVar12 = __lhs + 4;
    if (bVar3) goto LAB_001617d3;
    bVar3 = std::operator==(__lhs + 6,__file);
    pbVar12 = __lhs + 6;
    if (bVar3) goto LAB_001617d3;
    __lhs = __lhs + 8;
    lVar13 = lVar13 + -0x100;
  }
  lVar13 = lVar13 >> 6;
  if (lVar13 == 1) {
LAB_001617c2:
    bVar3 = std::operator==(__lhs,__file);
    pbVar12 = pbVar1;
    if (bVar3) {
      pbVar12 = __lhs;
    }
  }
  else if (lVar13 == 2) {
LAB_0016179c:
    bVar3 = std::operator==(pbVar12,__file);
    if (!bVar3) {
      __lhs = pbVar12 + 2;
      goto LAB_001617c2;
    }
  }
  else {
    pbVar12 = pbVar1;
    if ((lVar13 == 3) && (bVar3 = std::operator==(__lhs,__file), pbVar12 = __lhs, !bVar3)) {
      pbVar12 = __lhs + 2;
      goto LAB_0016179c;
    }
  }
LAB_001617d3:
  if (pbVar12 == DAT_0022a7c8) {
    this_01 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception(this_01,0xa004,"Device name \"%s\" not found",__file);
    __cxa_throw(this_01,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
  }
  pcVar14 = (pbVar12->_M_dataplus)._M_p;
  uVar9 = pbVar12[1]._M_dataplus._M_p;
LAB_001617e9:
  this_00 = &this->mMainloop;
  std::unique_lock<std::mutex>::unique_lock(&plock,&(this->mMainloop).mMutex);
  ppVar7 = PulseMainloop::connectContext(this_00,&plock);
  this->mContext = ppVar7;
  iVar4 = GetConfigValueBool((char *)0x0,"pulse","allow-moves",1);
  local_74.format = PA_SAMPLE_S16LE;
  local_74.rate = 0xac44;
  local_74.channels = '\x02';
  local_74._9_3_ = 0;
  if ((pointer)uVar9 == (pointer)0x0) {
    if (((anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_ == '\0') &&
       (iVar6 = __cxa_guard_acquire(&(anonymous_namespace)::PulsePlayback::open(char_const*)::
                                     defname_abi_cxx11_), iVar6 != 0)) {
      al::getenv_abi_cxx11_((al *)&local_58,"ALSOFT_PULSE_DEFAULT");
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::optional<true,_true>
                (&(anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_,
                 &local_58);
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~optional(&local_58);
      __cxa_atexit(al::
                   optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::~optional,
                   &(anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::PulsePlayback::open(char_const*)::
                           defname_abi_cxx11_);
    }
    uVar9 = (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1.
            mValue._M_dataplus._M_p;
    if ((anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.mHasValue ==
        false) {
      uVar9 = (pointer)0x0;
    }
  }
  if (2 < (int)gLogLevel) {
    _Var10._M_p = "(default)";
    if ((pointer)uVar9 != (pointer)0x0) {
      _Var10._M_p = (pointer)uVar9;
    }
    fprintf((FILE *)gLogFile,"[ALSOFT] (II) Connecting to \"%s\"\n",_Var10._M_p);
  }
  ppVar8 = PulseMainloop::connectStream
                     (this_00,(char *)uVar9,&plock,this->mContext,
                      (uint)(iVar4 == 0) << 9 |
                      (PA_STREAM_FIX_CHANNELS|PA_STREAM_FIX_RATE|PA_STREAM_FIX_FORMAT|
                      PA_STREAM_START_CORKED),(pa_buffer_attr *)0x0,&local_74,(pa_channel_map *)0x0,
                      Playback);
  this->mStream = ppVar8;
  (*(anonymous_namespace)::ppa_stream_set_moved_callback)(ppVar8,streamMovedCallbackC,this);
  pcVar2 = (anonymous_namespace)::ppa_frame_size;
  uVar9 = (*(anonymous_namespace)::ppa_stream_get_sample_spec)(this->mStream);
  AVar5 = (*pcVar2)(uVar9);
  this->mFrameSize = AVar5;
  (*(anonymous_namespace)::ppa_stream_get_device_name)(this->mStream);
  std::__cxx11::string::assign((char *)&this->mDeviceName);
  if (pcVar14 == (pointer)0x0) {
    op = (pa_operation *)
         (*(anonymous_namespace)::ppa_context_get_sink_info_by_name)
                   (this->mContext,(this->mDeviceName)._M_dataplus._M_p,sinkNameCallbackC,this);
    PulseMainloop::waitForOperation(this_00,op,&plock);
  }
  else {
    std::__cxx11::string::assign((char *)&((this->super_BackendBase).mDevice)->DeviceName);
  }
  std::unique_lock<std::mutex>::~unique_lock(&plock);
  return extraout_EAX;
}

Assistant:

void PulsePlayback::open(const ALCchar *name)
{
    const char *pulse_name{nullptr};
    const char *dev_name{nullptr};

    if(name)
    {
        if(PlaybackDevices.empty())
            mMainloop.probePlaybackDevices();

        auto iter = std::find_if(PlaybackDevices.cbegin(), PlaybackDevices.cend(),
            [name](const DevMap &entry) -> bool { return entry.name == name; });
        if(iter == PlaybackDevices.cend())
            throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};
        pulse_name = iter->device_name.c_str();
        dev_name = iter->name.c_str();
    }

    auto plock = mMainloop.getUniqueLock();
    mContext = mMainloop.connectContext(plock);

    pa_stream_flags_t flags{PA_STREAM_START_CORKED | PA_STREAM_FIX_FORMAT | PA_STREAM_FIX_RATE |
        PA_STREAM_FIX_CHANNELS};
    if(!GetConfigValueBool(nullptr, "pulse", "allow-moves", 1))
        flags |= PA_STREAM_DONT_MOVE;

    pa_sample_spec spec{};
    spec.format = PA_SAMPLE_S16NE;
    spec.rate = 44100;
    spec.channels = 2;

    if(!pulse_name)
    {
        static const auto defname = al::getenv("ALSOFT_PULSE_DEFAULT");
        if(defname) pulse_name = defname->c_str();
    }
    TRACE("Connecting to \"%s\"\n", pulse_name ? pulse_name : "(default)");
    mStream = mMainloop.connectStream(pulse_name, plock, mContext, flags, nullptr, &spec, nullptr,
        BackendType::Playback);

    pa_stream_set_moved_callback(mStream, &PulsePlayback::streamMovedCallbackC, this);
    mFrameSize = static_cast<ALuint>(pa_frame_size(pa_stream_get_sample_spec(mStream)));

    mDeviceName = pa_stream_get_device_name(mStream);
    if(!dev_name)
    {
        pa_operation *op{pa_context_get_sink_info_by_name(mContext, mDeviceName.c_str(),
            &PulsePlayback::sinkNameCallbackC, this)};
        mMainloop.waitForOperation(op, plock);
    }
    else
        mDevice->DeviceName = dev_name;
}